

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_chunk.cpp
# Opt level: O2

void __thiscall
duckdb::DataChunk::Append
          (DataChunk *this,DataChunk *other,bool resize,SelectionVector *sel,idx_t sel_count)

{
  uint64_t new_size;
  reference pvVar1;
  const_reference source;
  InternalException *pIVar2;
  pointer pVVar3;
  idx_t i_1;
  pointer pVVar4;
  idx_t iVar5;
  idx_t i;
  ulong uVar6;
  allocator local_61;
  idx_t local_60;
  idx_t local_58;
  string local_50;
  
  iVar5 = sel_count;
  if (sel == (SelectionVector *)0x0) {
    iVar5 = other->count;
  }
  if (other->count != 0) {
    pVVar4 = (this->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVVar3 = (this->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_58 = sel_count;
    if ((long)pVVar3 - (long)pVVar4 !=
        (long)(other->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(other->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_start) {
      pIVar2 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_50,"Column counts of appending chunk doesn\'t match!",&local_61);
      InternalException::InternalException(pIVar2,&local_50);
      __cxa_throw(pIVar2,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_60 = iVar5 + this->count;
    if (this->capacity < local_60) {
      if (!resize) {
        pIVar2 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_50,"Can\'t append chunk to other chunk without resizing",
                   &local_61);
        InternalException::InternalException(pIVar2,&local_50);
        __cxa_throw(pIVar2,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      new_size = NextPowerOfTwo(local_60);
      uVar6 = 0;
      while( true ) {
        pVVar4 = (this->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pVVar3 = (this->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if ((ulong)(((long)pVVar3 - (long)pVVar4) / 0x68) <= uVar6) break;
        pvVar1 = vector<duckdb::Vector,_true>::get<true>(&this->data,uVar6);
        Vector::Resize(pvVar1,this->count,new_size);
        uVar6 = uVar6 + 1;
      }
      this->capacity = new_size;
    }
    for (uVar6 = 0; uVar6 < (ulong)(((long)pVVar3 - (long)pVVar4) / 0x68); uVar6 = uVar6 + 1) {
      source = vector<duckdb::Vector,_true>::get<true>(&other->data,uVar6);
      pvVar1 = vector<duckdb::Vector,_true>::get<true>(&this->data,uVar6);
      if (sel == (SelectionVector *)0x0) {
        VectorOperations::Copy(source,pvVar1,other->count,0,this->count);
      }
      else {
        VectorOperations::Copy(source,pvVar1,sel,local_58,0,this->count);
      }
      pVVar4 = (this->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_start;
      pVVar3 = (this->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    this->count = local_60;
  }
  return;
}

Assistant:

void DataChunk::Append(const DataChunk &other, bool resize, SelectionVector *sel, idx_t sel_count) {
	idx_t new_size = sel ? size() + sel_count : size() + other.size();
	if (other.size() == 0) {
		return;
	}
	if (ColumnCount() != other.ColumnCount()) {
		throw InternalException("Column counts of appending chunk doesn't match!");
	}
	if (new_size > capacity) {
		if (resize) {
			auto new_capacity = NextPowerOfTwo(new_size);
			for (idx_t i = 0; i < ColumnCount(); i++) {
				data[i].Resize(size(), new_capacity);
			}
			capacity = new_capacity;
		} else {
			throw InternalException("Can't append chunk to other chunk without resizing");
		}
	}
	for (idx_t i = 0; i < ColumnCount(); i++) {
		D_ASSERT(data[i].GetVectorType() == VectorType::FLAT_VECTOR);
		if (sel) {
			VectorOperations::Copy(other.data[i], data[i], *sel, sel_count, 0, size());
		} else {
			VectorOperations::Copy(other.data[i], data[i], other.size(), 0, size());
		}
	}
	SetCardinality(new_size);
}